

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

output_type *
dnet::data_types::vec_flater<int,_2U>::flatten(output_type *__return_storage_ptr__,input_type *arr)

{
  pointer pvVar1;
  pointer __x;
  vector<int,_std::allocator<int>_> a;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (arr->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (arr->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,__x);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,
               (vector<int,_std::allocator<int>_> *)&local_48);
    local_88._M_impl.super__Vector_impl_data._M_start =
         local_68._M_impl.super__Vector_impl_data._M_start;
    local_88._M_impl.super__Vector_impl_data._M_finish =
         local_68._M_impl.super__Vector_impl_data._M_finish;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_88._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_88._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type flatten(input_type arr)
            {
                std::vector<T> ret;
                for (auto a : arr) {
                    std::vector<T> res = vec_flater<T, N - 1>::flatten(a);
                    ret.insert(ret.end(), res.begin(), res.end());
                }
                return ret;
            }